

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

limits * nuraft::raft_server::get_raft_limits(void)

{
  limits *in_RDI;
  
  LOCK();
  (in_RDI->pre_vote_rejection_limit_).super___atomic_base<int>._M_i = raft_limits_;
  UNLOCK();
  LOCK();
  (in_RDI->warning_limit_).super___atomic_base<int>._M_i = DAT_005da96c;
  UNLOCK();
  LOCK();
  (in_RDI->response_limit_).super___atomic_base<int>._M_i = DAT_005da970;
  UNLOCK();
  LOCK();
  (in_RDI->leadership_limit_).super___atomic_base<int>._M_i = DAT_005da974;
  UNLOCK();
  LOCK();
  (in_RDI->reconnect_limit_).super___atomic_base<int>._M_i = DAT_005da978;
  UNLOCK();
  LOCK();
  (in_RDI->leave_limit_).super___atomic_base<int>._M_i = DAT_005da97c;
  UNLOCK();
  LOCK();
  (in_RDI->vote_limit_).super___atomic_base<int>._M_i = DAT_005da980;
  UNLOCK();
  return in_RDI;
}

Assistant:

raft_server::limits raft_server::get_raft_limits() {
    return raft_limits_;
}